

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall
Lib::
Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
::Entry::~Entry(Entry *this)

{
  bool bVar1;
  Entry *in_RDI;
  
  bVar1 = occupied(in_RDI);
  if (bVar1) {
    key(in_RDI);
    value(in_RDI);
    Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>::~AnyNumber
              ((AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)0x73a74f);
  }
  return;
}

Assistant:

inline ~Entry()
    {
      if (occupied()) {
        key().~Key();
        value().~Val();
      }
    }